

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall ktx::ValidationContext::validateKVD(ValidationContext *this)

{
  uint *puVar1;
  string *psVar2;
  size_type *psVar3;
  short *psVar4;
  size_type sVar5;
  uint uVar6;
  pointer pKVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  uint *puVar12;
  KeyValueEntry *pKVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  iterator iVar16;
  ushort uVar17;
  code *pcVar18;
  _Alloc_hider *p_Var19;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var20;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *poVar21;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *extraout_RDX_00;
  KeyValueEntry *entry;
  uint *bufferEnd;
  pointer pKVar22;
  ktx_uint8_t *pkVar23;
  IssueError *pIVar24;
  __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
  __i;
  __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
  __last;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  KeyValueEntry *pKVar30;
  long lVar31;
  uint *ptr;
  pointer pKVar32;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_02;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar33;
  uint32_t sizeKeyValuePair;
  optional<unsigned_long> invalidIndex;
  vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> entries;
  ktx_uint32_t kvdByteLength;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
  kvValidators;
  long remainingKVDBytes;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  keys;
  uint local_10c;
  code *local_108;
  undefined8 local_100;
  vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> local_f8;
  uint local_d8;
  uint local_d4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d0;
  uint *local_98;
  __buckets_ptr local_90;
  uint *local_88;
  uint *local_80;
  long local_78;
  KeyValueEntry *local_70;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *extraout_RDX;
  
  uVar15 = (ulong)(this->header).keyValueData.byteOffset;
  local_d4 = (this->header).keyValueData.byteLength;
  if (local_d4 != 0 && uVar15 != 0) {
    uVar28 = (ulong)local_d4;
    puVar12 = (uint *)operator_new__(uVar28);
    memset(puVar12,0,uVar28);
    pIVar24 = (IssueError *)0x12;
    local_88 = puVar12;
    (*this->_vptr_ValidationContext[2])(this,uVar15,puVar12,uVar28,0x12,"the Key/Value Data");
    bufferEnd = (uint *)((ulong)local_d4 + (long)puVar12);
    local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (KeyValueEntry *)0x0;
    local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (KeyValueEntry *)0x0;
    local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (KeyValueEntry *)0x0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    ptr = puVar12;
    uVar25 = 0;
    do {
      if (bufferEnd <= ptr) break;
      local_78 = (long)bufferEnd - (long)ptr;
      if (uVar25 + 1 < 0x65) {
        if (local_78 < 6) {
          error<long_const&>(this,&Metadata::NotEnoughDataForAnEntry,&local_78);
          goto LAB_001ab0c4;
        }
        local_10c = *ptr;
        if ((ulong)local_10c < 2) {
          error<unsigned_int&>(this,&Metadata::KeyAndValueByteLengthTooSmall,&local_10c);
        }
        else {
          puVar1 = ptr + 1;
          if (bufferEnd < (uint *)((ulong)local_10c + (long)puVar1)) {
            local_d0._M_buckets = (__buckets_ptr)((long)bufferEnd - (long)puVar1);
            error<unsigned_int&,long_const&>
                      (this,&Metadata::KeyAndValueByteLengthTooLarge,&local_10c,(long *)&local_d0);
            local_10c = (uint)local_d0._M_buckets;
          }
          puVar12 = local_88;
          uVar6 = local_10c;
          uVar15 = 0;
          if (local_10c != 0) {
            do {
              if (*(char *)((long)puVar1 + uVar15) == '\0') goto LAB_001ab14e;
              uVar15 = uVar15 + 1;
            } while (local_10c != (uint)uVar15);
            uVar15 = (ulong)local_10c;
          }
LAB_001ab14e:
          uVar26 = (uint)uVar15;
          if (uVar26 == 0) {
            error<>(this,&Metadata::KeyEmpty);
          }
          else {
            local_90 = (__buckets_ptr)(uVar15 & 0xffffffff);
            local_d8 = ~uVar26 + local_10c;
            if (uVar26 == local_10c) {
              local_d8 = 0;
            }
            pcVar18 = (code *)(ulong)local_d8;
            local_d0._M_buckets = local_90;
            local_d0._M_bucket_count = (size_type)puVar1;
            if ((2 < uVar26) &&
               (uVar17 = *(byte *)((long)ptr + 6) ^ 0xbf | (ushort)*puVar1 ^ 0xbbef,
               pcVar18 = (code *)(ulong)uVar17, uVar17 == 0)) {
              local_d0._M_bucket_count = (long)ptr + 7;
              local_d0._M_buckets = (__buckets_ptr)((long)local_90 - 3);
              error<std::basic_string_view<char,std::char_traits<char>>&>
                        (this,&Metadata::KeyForbiddenBOM,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_d0);
            }
            local_90 = (__buckets_ptr)((long)puVar1 + (long)local_90 + 1);
            puVar12 = (uint *)((long)local_d0._M_buckets + local_d0._M_bucket_count);
            local_98 = (uint *)local_d0._M_bucket_count;
            local_80 = (uint *)local_d0._M_bucket_count;
            do {
              if (local_80 == puVar12) {
                cVar10 = '\0';
                goto LAB_001ab259;
              }
              bVar9 = advanceUTF8<char_const*>((char **)&local_80,(char *)puVar12);
            } while (bVar9);
            pcVar18 = (code *)((long)local_80 - (long)local_98);
            cVar10 = '\x01';
LAB_001ab259:
            local_100 = CONCAT71(local_100._1_7_,cVar10);
            local_108 = pcVar18;
            if (cVar10 != '\0') {
              error<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&>
                        (this,&Metadata::KeyInvalidUTF8,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_d0,
                         (unsigned_long *)&local_108);
            }
            if (uVar26 == uVar6) {
              error<std::basic_string_view<char,std::char_traits<char>>&>
                        (this,&Metadata::KeyMissingNullTerminator,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_d0);
            }
            pKVar7 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              if ((long)local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                        _M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              lVar27 = (long)local_f8.
                             super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f8.
                             super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 4;
              uVar28 = lVar27 * -0x5555555555555555;
              local_70 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              uVar15 = uVar28;
              if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl
                  .super__Vector_impl_data._M_finish ==
                  local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl
                  .super__Vector_impl_data._M_start) {
                uVar15 = 1;
              }
              local_98 = (uint *)(uVar15 + uVar28);
              if ((uint *)0x2aaaaaaaaaaaaa9 < local_98) {
                local_98 = (uint *)0x2aaaaaaaaaaaaaa;
              }
              if (CARRY8(uVar15,uVar28)) {
                local_98 = (uint *)0x2aaaaaaaaaaaaaa;
              }
              if (local_98 == (uint *)0x0) {
                pKVar13 = (KeyValueEntry *)0x0;
              }
              else {
                pKVar13 = (KeyValueEntry *)operator_new((long)local_98 * 0x30);
              }
              psVar2 = (string *)(&(pKVar13->key)._M_dataplus + lVar27 * 2);
              p_Var19 = &(pKVar13->key)._M_dataplus + lVar27 * 2;
              p_Var19->_M_p = (pointer)(p_Var19 + 2);
              std::__cxx11::string::_M_construct<char_const*>
                        (psVar2,local_d0._M_bucket_count,
                         (long)local_d0._M_buckets + local_d0._M_bucket_count);
              puVar12 = local_98;
              *(__buckets_ptr *)(psVar2 + 0x20) = local_90;
              *(uint *)(psVar2 + 0x28) = local_d8;
              pKVar30 = pKVar13;
              if (pKVar7 != local_70) {
                paVar14 = &(local_70->key).field_2;
                paVar8 = &(pKVar13->key).field_2;
                do {
                  paVar29 = paVar8;
                  (((key_type *)(paVar29 + -1))->_M_dataplus)._M_p = (pointer)paVar29;
                  psVar3 = (size_type *)(((key_type *)(paVar14 + -1))->_M_dataplus)._M_p;
                  if (paVar14 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar3) {
                    sVar5 = *(size_type *)((long)paVar14 + 8);
                    paVar29->_M_allocated_capacity = paVar14->_M_allocated_capacity;
                    *(size_type *)((long)paVar29 + 8) = sVar5;
                  }
                  else {
                    (((key_type *)(paVar29 + -1))->_M_dataplus)._M_p = (pointer)psVar3;
                    paVar29->_M_allocated_capacity = paVar14->_M_allocated_capacity;
                  }
                  *(size_type *)((long)paVar29 + -8) = *(size_type *)((long)paVar14 + -8);
                  (((key_type *)(paVar14 + -1))->_M_dataplus)._M_p = (pointer)paVar14;
                  *(size_type *)((long)paVar14 + -8) = 0;
                  paVar14->_M_local_buf[0] = '\0';
                  *(undefined4 *)((long)paVar29 + 0x18) = *(undefined4 *)((long)paVar14 + 0x18);
                  paVar29[1]._M_allocated_capacity = paVar14[1]._M_allocated_capacity;
                  pKVar30 = (KeyValueEntry *)(paVar14 + 2);
                  paVar14 = paVar14 + 3;
                  paVar8 = paVar29 + 3;
                } while (pKVar30 != pKVar7);
                pKVar30 = (KeyValueEntry *)(paVar29 + 2);
              }
              if (local_70 != (KeyValueEntry *)0x0) {
                operator_delete(local_70,(long)local_f8.
                                               super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)local_70);
              }
              local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = pKVar13 + (long)puVar12;
              local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_start = pKVar13;
            }
            else {
              ((local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_finish)->key)._M_dataplus._M_p =
                   (pointer)&((local_f8.
                               super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                               _M_impl.super__Vector_impl_data._M_finish)->key).field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)
                         local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish,local_d0._M_bucket_count,
                         (long)local_d0._M_buckets + local_d0._M_bucket_count);
              pKVar7->data = (uint8_t *)local_90;
              pKVar7->size = local_d8;
              pKVar30 = pKVar7;
            }
            local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
            super__Vector_impl_data._M_finish = pKVar30 + 1;
            pVar33 = std::
                     _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&>
                               ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)&local_68,&local_d0);
            puVar12 = local_88;
            if (((undefined1  [16])pVar33 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              error<std::basic_string_view<char,std::char_traits<char>>&>
                        (this,&Metadata::DuplicateKey,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_d0);
              puVar12 = local_88;
            }
          }
        }
        uVar6 = local_10c;
        pIVar24 = &Metadata::PaddingNotZero;
        validateAlignmentPaddingZeros<char_const(&)[24]>
                  (this,(void *)((long)ptr + (ulong)local_10c + 4),bufferEnd,4,
                   &Metadata::PaddingNotZero,(char (*) [24])"after a Key-Value entry");
        ptr = (uint *)((long)ptr + (ulong)uVar6 + 7 & 0xfffffffffffffffc);
        bVar9 = true;
      }
      else {
        local_d0._M_buckets = (__buckets_ptr)CONCAT44(local_d0._M_buckets._4_4_,uVar25);
        warning<unsigned_int,long_const&>
                  (this,&Metadata::TooManyEntries,(uint *)&local_d0,&local_78);
LAB_001ab0c4:
        bVar9 = false;
        ptr = bufferEnd;
      }
      uVar25 = uVar25 + 1;
    } while (bVar9);
    if (ptr != bufferEnd) {
      local_d0._M_buckets = (__buckets_ptr)((long)ptr - (long)puVar12);
      error<long,unsigned_int_const&>(this,&Metadata::SizesDontAddUp,(long *)&local_d0,&local_d4);
    }
    if ((this->header).supercompressionGlobalData.byteLength != 0) {
      pIVar24 = &Metadata::PaddingNotZero;
      validateAlignmentPaddingZeros<char_const(&)[25]>
                (this,ptr,bufferEnd,8,&Metadata::PaddingNotZero,
                 (char (*) [25])"after the last KVD entry");
    }
    pKVar7 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pKVar22 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pKVar32 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pKVar13 = pKVar32;
        pKVar32 = pKVar13 + 1;
        if (pKVar32 == pKVar7) break;
        iVar11 = std::__cxx11::string::compare((string *)pKVar32);
      } while (-1 < iVar11);
      pKVar22 = pKVar13 + 1;
    }
    if (pKVar22 != pKVar7) {
      error<>(this,&Metadata::OutOfOrder);
      pKVar22 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pKVar7 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_d0._M_buckets = (__buckets_ptr)0x0;
      if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar31 = (long)local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar15 = (lVar31 >> 4) * -0x5555555555555555;
        lVar27 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar27 == 0; lVar27 = lVar27 + -1) {
          }
        }
        p_Var20 = &local_d0;
        __comp_00._M_comp.proj =
             (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)pIVar24;
        __comp_00._M_comp.comp = (less<void> *)p_Var20;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                    )local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                    )local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar27 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
        if (lVar31 < 0x301) {
          __comp_02._M_comp.proj =
               (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *)p_Var20;
          __comp_02._M_comp.comp = (less<void> *)&local_d0;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                      )pKVar7,(__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                               )pKVar22,__comp_02);
        }
        else {
          __last._M_current = pKVar7 + 0x10;
          __comp_01._M_comp.proj =
               (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *)p_Var20;
          __comp_01._M_comp.comp = (less<void> *)&local_d0;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                      )pKVar7,__last,__comp_01);
          if (__last._M_current != pKVar22) {
            poVar21 = extraout_RDX;
            do {
              __comp._M_comp.proj = poVar21;
              __comp._M_comp.comp = (less<void> *)&local_d0;
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Val_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                        (__last,__comp);
              __last._M_current = __last._M_current + 1;
              poVar21 = extraout_RDX_00;
            } while (__last._M_current != pKVar22);
          }
        }
      }
    }
    local_d0._M_buckets = &local_d0._M_single_bucket;
    local_d0._M_bucket_count = 1;
    local_d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_d0._M_element_count = 0;
    local_d0._M_rehash_policy._M_max_load_factor = 1.0;
    local_d0._M_rehash_policy._M_next_resize = 0;
    local_d0._M_single_bucket = (__node_base_ptr)0x0;
    local_108 = validateKTXcubemapIncomplete;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[21],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXcubemapIncomplete");
    local_108 = validateKTXorientation;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[15],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXorientation");
    local_108 = validateKTXglFormat;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[12],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXglFormat");
    local_108 = validateKTXdxgiFormat;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[16],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXdxgiFormat__");
    local_108 = validateKTXmetalPixelFormat;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[20],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXmetalPixelFormat");
    local_108 = validateKTXswizzle;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[11],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXswizzle");
    local_108 = validateKTXwriter;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[10],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXwriter");
    local_108 = validateKTXwriterScParams;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[18],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXwriterScParams");
    local_108 = validateKTXastcDecodeMode;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[18],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXastcDecodeMode");
    local_108 = validateKTXanimData;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[12],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d0,"KTXanimData");
    pKVar7 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pKVar22 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar16 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_d0,&pKVar22->key);
        if (iVar16.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
            ._M_cur == (__node_type *)0x0) {
          psVar4 = (short *)(pKVar22->key)._M_dataplus._M_p;
          uVar15 = (pKVar22->key)._M_string_length;
          if (((uVar15 < 3) || ((char)psVar4[1] != 'X' || *psVar4 != 0x544b)) &&
             ((uVar15 < 3 || ((char)psVar4[1] != 'x' || *psVar4 != 0x746b)))) {
            warning<std::__cxx11::string_const&>(this,&Metadata::CustomMetadata,&pKVar22->key);
          }
          else {
            error<std::__cxx11::string_const&>(this,&Metadata::UnknownReservedKey,&pKVar22->key);
          }
        }
        else {
          pcVar18 = *(code **)((long)iVar16.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                                     ._M_cur + 0x28);
          pkVar23 = (this->header).identifier +
                    *(long *)((long)iVar16.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                                    ._M_cur + 0x30) + -0x38;
          if (((ulong)pcVar18 & 1) != 0) {
            pcVar18 = *(code **)(pcVar18 + *(long *)pkVar23 + -1);
          }
          (*pcVar18)(pkVar23,pKVar22->data,pKVar22->size);
        }
        pKVar22 = pKVar22 + 1;
      } while (pKVar22 != pKVar7);
    }
    if ((this->foundKTXanimData != false) && (this->foundKTXcubemapIncomplete == true)) {
      error<>(this,&Metadata::KTXanimDataWithCubeIncomplete);
    }
    if (this->foundKTXwriter == false) {
      if (this->foundKTXwriterScParams == true) {
        error<>(this,&Metadata::KTXwriterRequiredButMissing);
      }
      else {
        warning<>(this,&Metadata::KTXwriterMissing);
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_d0);
    std::
    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::~vector(&local_f8);
    operator_delete__(puVar12);
  }
  return;
}

Assistant:

void ValidationContext::validateKVD() {
    const auto kvdByteOffset = header.keyValueData.byteOffset;
    const auto kvdByteLength = header.keyValueData.byteLength;

    if (kvdByteOffset == 0 || kvdByteLength == 0)
        return; // There is no KVD block

    const auto buffer = std::make_unique<uint8_t[]>(kvdByteLength);
    read(kvdByteOffset, buffer.get(), kvdByteLength, "the Key/Value Data");
    const auto* ptrKVD = buffer.get();
    const auto* ptrKVDEnd = ptrKVD + kvdByteLength;

    struct KeyValueEntry {
        std::string key;
        const uint8_t* data;
        uint32_t size;

        KeyValueEntry(std::string_view key, const uint8_t* data, uint32_t size) :
                key(key), data(data), size(size) {}
    };
    std::vector<KeyValueEntry> entries;
    std::unordered_set<std::string_view> keys;

    uint32_t numKVEntry = 0;
    // Process Key-Value entries {size, key, \0, value} until the end of the KVD block
    // Where size is an uint32_t, and it equals to: sizeof(key) + 1 + sizeof(value)
    const auto* ptrEntry = ptrKVD;
    while (ptrEntry < ptrKVDEnd) {
        const auto remainingKVDBytes = ptrKVDEnd - ptrEntry;

        if (++numKVEntry > MAX_NUM_KV_ENTRIES) {
            warning(Metadata::TooManyEntries, numKVEntry - 1, remainingKVDBytes);
            ptrEntry = ptrKVDEnd;
            break;
        }

        if (remainingKVDBytes < 6) {
            error(Metadata::NotEnoughDataForAnEntry, remainingKVDBytes);
            ptrEntry = ptrKVDEnd;
            break;
        }

        uint32_t sizeKeyValuePair;
        std::memcpy(&sizeKeyValuePair, ptrEntry, sizeof(uint32_t));

        const auto* ptrKeyValuePair = ptrEntry + sizeof(uint32_t);
        const auto* ptrKey = ptrKeyValuePair;

        if (sizeKeyValuePair < 2) {
            error(Metadata::KeyAndValueByteLengthTooSmall, sizeKeyValuePair);
        } else {
            if (ptrKeyValuePair + sizeKeyValuePair > ptrKVDEnd) {
                const auto bytesLeft = ptrKVDEnd - ptrKeyValuePair;
                error(Metadata::KeyAndValueByteLengthTooLarge, sizeKeyValuePair, bytesLeft);
                sizeKeyValuePair = static_cast<uint32_t>(bytesLeft); // Attempt recovery to read out at least the key
            }

            // Determine key, finding the null terminator
            uint32_t sizeKey = 0;
            while (sizeKey < sizeKeyValuePair && ptrKey[sizeKey] != '\0')
                ++sizeKey;

            if (sizeKey == 0) {
                error(Metadata::KeyEmpty);
            } else {
                const auto keyHasNullTerminator = sizeKey != sizeKeyValuePair;
                auto key = std::string_view(reinterpret_cast<const char*>(ptrKey), sizeKey);

                // Determine the value
                const auto* ptrValue = ptrKey + sizeKey + 1;
                const auto sizeValue = keyHasNullTerminator ? sizeKeyValuePair - sizeKey - 1 : 0;

                // Check for BOM
                if (starts_with(key, "\xEF\xBB\xBF")) {
                    key.remove_prefix(3);
                    error(Metadata::KeyForbiddenBOM, key);
                }

                if (auto invalidIndex = validateUTF8(key))
                    error(Metadata::KeyInvalidUTF8, key, *invalidIndex);

                if (!keyHasNullTerminator)
                    error(Metadata::KeyMissingNullTerminator, key);

                entries.emplace_back(key, ptrValue, sizeValue);

                if (!keys.emplace(key).second)
                    error(Metadata::DuplicateKey, key);
            }
        }

        // Finish entry
        ptrEntry += sizeof(uint32_t) + sizeKeyValuePair;
        validateAlignmentPaddingZeros(ptrEntry, ptrKVDEnd, 4, Metadata::PaddingNotZero, "after a Key-Value entry");
        ptrEntry = align(ptrEntry, 4);
    }

    if (ptrEntry != ptrKVDEnd)
        // Being super explicit about the specs. This check might be overkill as other checks often cover this case
        error(Metadata::SizesDontAddUp, ptrEntry - ptrKVD, kvdByteLength);

    if (header.supercompressionGlobalData.byteLength != 0)
        validateAlignmentPaddingZeros(ptrEntry, ptrKVDEnd, 8, Metadata::PaddingNotZero, "after the last KVD entry");

    if (!is_sorted(entries, std::less<>{}, &KeyValueEntry::key)) {
        error(Metadata::OutOfOrder);
        sort(entries, std::less<>{}, &KeyValueEntry::key);
    }

    using MemberFN = void(ValidationContext::*)(const uint8_t*, uint32_t);
    std::unordered_map<std::string, MemberFN> kvValidators;

    kvValidators.emplace("KTXcubemapIncomplete", &ValidationContext::validateKTXcubemapIncomplete);
    kvValidators.emplace("KTXorientation", &ValidationContext::validateKTXorientation);
    kvValidators.emplace("KTXglFormat", &ValidationContext::validateKTXglFormat);
    kvValidators.emplace("KTXdxgiFormat__", &ValidationContext::validateKTXdxgiFormat);
    kvValidators.emplace("KTXmetalPixelFormat", &ValidationContext::validateKTXmetalPixelFormat);
    kvValidators.emplace("KTXswizzle", &ValidationContext::validateKTXswizzle);
    kvValidators.emplace("KTXwriter", &ValidationContext::validateKTXwriter);
    kvValidators.emplace("KTXwriterScParams", &ValidationContext::validateKTXwriterScParams);
    kvValidators.emplace("KTXastcDecodeMode", &ValidationContext::validateKTXastcDecodeMode);
    kvValidators.emplace("KTXanimData", &ValidationContext::validateKTXanimData);

    for (const auto& entry : entries) {
        const auto it = kvValidators.find(entry.key);
        if (it != kvValidators.end()) {
            (this->*it->second)(entry.data, entry.size);
        } else {
            if (starts_with(entry.key, "KTX") || starts_with(entry.key, "ktx"))
                error(Metadata::UnknownReservedKey, entry.key);
            else
                warning(Metadata::CustomMetadata, entry.key);
        }
    }

    if (foundKTXanimData && foundKTXcubemapIncomplete)
        error(Metadata::KTXanimDataWithCubeIncomplete);

    if (!foundKTXwriter) {
        if (foundKTXwriterScParams)
            error(Metadata::KTXwriterRequiredButMissing);
        else
            warning(Metadata::KTXwriterMissing);
    }
}